

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__matrixrow
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  URI *this_00;
  ParserChar *text;
  long lVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  uint *puVar8;
  StringHash SVar9;
  void *pvVar10;
  char cVar11;
  xmlChar **ppxVar12;
  bool failed;
  ParserChar *attributeValue;
  bool local_131;
  ParserChar *local_130;
  StackMemoryManager *local_128;
  uint *local_120;
  URI local_118;
  
  local_128 = &(this->
               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
               ).super_ParserTemplateBase.mStackMemoryManager;
  puVar8 = (uint *)GeneratedSaxParser::StackMemoryManager::newObject(local_128,0x128);
  uVar2 = matrixrow__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)puVar8 = matrixrow__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(puVar8 + 2) = uVar2;
  uVar2 = matrixrow__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(puVar8 + 4) = matrixrow__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(puVar8 + 6) = uVar2;
  uVar2 = matrixrow__AttributeData::DEFAULT._40_8_;
  *(undefined8 *)(puVar8 + 8) = matrixrow__AttributeData::DEFAULT._32_8_;
  *(undefined8 *)(puVar8 + 10) = uVar2;
  this_00 = (URI *)(puVar8 + 0xc);
  COLLADABU::URI::URI(this_00,(URI *)(matrixrow__AttributeData::DEFAULT + 0x30),false);
  uVar5 = matrixrow__AttributeData::DEFAULT._292_4_;
  uVar4 = matrixrow__AttributeData::DEFAULT._288_4_;
  uVar3 = matrixrow__AttributeData::DEFAULT._284_4_;
  puVar8[0x46] = matrixrow__AttributeData::DEFAULT._280_4_;
  puVar8[0x47] = uVar3;
  puVar8[0x48] = uVar4;
  puVar8[0x49] = uVar5;
  *attributeDataPtr = puVar8;
  ppxVar12 = attributes->attributes;
  if (ppxVar12 != (xmlChar **)0x0) {
    local_120 = puVar8 + 0x46;
    do {
      text = *ppxVar12;
      if (text == (ParserChar *)0x0) {
        cVar11 = '\x03';
      }
      else {
        SVar9 = GeneratedSaxParser::Utils::calculateStringHash(text);
        local_130 = ppxVar12[1];
        if ((long)SVar9 < 0x7f8b6) {
          if (SVar9 == 0x6f4) {
            *(ParserChar **)(puVar8 + 10) = local_130;
          }
          else if (SVar9 == 0x6f8b6) {
            GeneratedSaxParser::Utils::toURI(&local_118,&local_130,&local_131);
            COLLADABU::URI::operator=(this_00,&local_118);
            COLLADABU::URI::~URI(&local_118);
            if (local_131 == true) {
              bVar6 = false;
              bVar7 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0xb908ce7,0x6f8b6,local_130);
              if (!bVar7) goto LAB_00769c5a;
              cVar11 = '\x01';
            }
            else {
LAB_00769c5a:
              cVar11 = '\x04';
              bVar6 = true;
              if (local_131 == false) {
                *(byte *)puVar8 = (byte)*puVar8 | 2;
              }
            }
            if (!bVar6) goto LAB_00769ce2;
          }
          else {
LAB_00769c3e:
            if (*(long *)local_120 == 0) {
              pvVar10 = GeneratedSaxParser::StackMemoryManager::newObject(local_128,0x10);
            }
            else {
              pvVar10 = GeneratedSaxParser::StackMemoryManager::growObject(local_128,0x10);
            }
            *(void **)(puVar8 + 0x46) = pvVar10;
            lVar1 = *(long *)(puVar8 + 0x48);
            *(ParserChar **)((long)pvVar10 + lVar1 * 8) = text;
            *(ParserChar **)(*(long *)(puVar8 + 0x46) + 8 + lVar1 * 8) = local_130;
            *(long *)(puVar8 + 0x48) = lVar1 + 2;
          }
LAB_00769ce0:
          cVar11 = '\0';
        }
        else {
          if (SVar9 == 0x7f8b6) {
            *(ParserChar **)(puVar8 + 8) = local_130;
            goto LAB_00769ce0;
          }
          if (SVar9 == 0x7ac025) {
            *(ParserChar **)(puVar8 + 6) = local_130;
            goto LAB_00769ce0;
          }
          if (SVar9 != 0x6a28a3) goto LAB_00769c3e;
          bVar6 = GeneratedSaxParser::
                  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                  ::
                  characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                            (&this->
                              super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                             ,local_130,(XSList<GeneratedSaxParser::ParserString> *)(puVar8 + 2));
          if (bVar6) {
            *(byte *)puVar8 = (byte)*puVar8 | 1;
            cVar11 = '\x04';
            bVar6 = true;
          }
          else {
            bVar6 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0xb908ce7,0x6a28a3,local_130);
            bVar6 = !bVar6;
            cVar11 = bVar6 * '\x03' + '\x01';
          }
          if (bVar6) goto LAB_00769ce0;
        }
LAB_00769ce2:
        ppxVar12 = ppxVar12 + 2;
      }
    } while (cVar11 == '\0');
    if (cVar11 != '\x03') {
      return false;
    }
  }
  if ((*puVar8 & 1) == 0) {
    puVar8[2] = 0;
    puVar8[3] = 0;
    puVar8[4] = 0;
    puVar8[5] = 0;
  }
  if ((*puVar8 & 2) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(this_00,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__matrixrow( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__matrixrow( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

matrixrow__AttributeData* attributeData = newData<matrixrow__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_MATRIXROW, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATRIXROW,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_MATRIXROW,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= matrixrow__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATRIXROW,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= matrixrow__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & matrixrow__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & matrixrow__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}